

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image_png.c
# Opt level: O0

HPDF_STATUS CreatePallet(HPDF_Dict_conflict image,png_structp png_ptr,png_infop info_ptr)

{
  int iVar1;
  HPDF_BYTE *value;
  HPDF_Array array_00;
  HPDF_Binary obj;
  HPDF_BYTE *pHVar2;
  HPDF_Binary b;
  HPDF_Array array;
  HPDF_BYTE *pHStack_48;
  HPDF_INT i;
  HPDF_BYTE *p;
  HPDF_BYTE *ppallet;
  png_color *src_pl;
  png_infop ppStack_28;
  HPDF_INT num_pl;
  png_infop info_ptr_local;
  png_structp png_ptr_local;
  HPDF_Dict_conflict image_local;
  
  src_pl._4_4_ = 0;
  ppallet = (HPDF_BYTE *)0x0;
  ppStack_28 = info_ptr;
  info_ptr_local = (png_infop)png_ptr;
  png_ptr_local = (png_structp)image;
  iVar1 = png_get_PLTE(png_ptr,info_ptr,&ppallet,(long)&src_pl + 4);
  if (iVar1 == 8) {
    value = (HPDF_BYTE *)HPDF_GetMem(*(HPDF_MMgr *)(png_ptr_local + 8),src_pl._4_4_ * 3);
    if (value == (HPDF_BYTE *)0x0) {
      image_local = (HPDF_Dict_conflict)**(undefined8 **)(png_ptr_local + 0x10);
    }
    else {
      pHStack_48 = value;
      for (array._4_4_ = 0; array._4_4_ < src_pl._4_4_; array._4_4_ = array._4_4_ + 1) {
        *pHStack_48 = *ppallet;
        pHVar2 = pHStack_48 + 2;
        pHStack_48[1] = ppallet[1];
        pHStack_48 = pHStack_48 + 3;
        *pHVar2 = ppallet[2];
        ppallet = ppallet + 3;
      }
      array_00 = HPDF_Array_New(*(HPDF_MMgr *)(png_ptr_local + 8));
      if (array_00 != (HPDF_Array)0x0) {
        HPDF_Dict_Add((HPDF_Dict)png_ptr_local,"ColorSpace",array_00);
        HPDF_Array_AddName(array_00,"Indexed");
        HPDF_Array_AddName(array_00,"DeviceRGB");
        HPDF_Array_AddNumber(array_00,src_pl._4_4_ + -1);
        obj = HPDF_Binary_New(*(HPDF_MMgr *)(png_ptr_local + 8),value,src_pl._4_4_ * 3);
        if (obj != (HPDF_Binary)0x0) {
          HPDF_Array_Add(array_00,obj);
        }
      }
      HPDF_FreeMem(*(HPDF_MMgr *)(png_ptr_local + 8),value);
      image_local = (HPDF_Dict_conflict)**(undefined8 **)(png_ptr_local + 0x10);
    }
  }
  else {
    image_local = (HPDF_Dict_conflict)
                  HPDF_SetError(*(HPDF_Error *)(png_ptr_local + 0x10),0x1043,0x1005);
  }
  return (HPDF_STATUS)image_local;
}

Assistant:

static HPDF_STATUS
CreatePallet (HPDF_Dict    image,
              png_structp  png_ptr,
              png_infop    info_ptr)
{
    HPDF_INT num_pl = 0;
    png_color *src_pl = NULL;
    HPDF_BYTE *ppallet;
    HPDF_BYTE *p;
    HPDF_INT i;
    HPDF_Array array;

    /* png_get_PLTE does not call PngErrorFunc even if it failed.
     * so we call HPDF_Set_Error to set error-code.
     */
    if (png_get_PLTE(png_ptr, info_ptr, (png_color**)&src_pl, &num_pl) !=
            PNG_INFO_PLTE)
        return HPDF_SetError (image->error, HPDF_LIBPNG_ERROR,
                    HPDF_CANNOT_GET_PALLET);


    /* make a pallet array for indexed image. */
    ppallet = HPDF_GetMem (image->mmgr, num_pl * 3);
    if (!ppallet)
        return image->error->error_no;

    p = ppallet;
    for (i = 0; i < num_pl; i++, src_pl++) {
        *p++ = src_pl->red;
        *p++ = src_pl->green;
        *p++ = src_pl->blue;
    }

    array = HPDF_Array_New (image->mmgr);
    if (array) {
        HPDF_Binary b;

        HPDF_Dict_Add (image, "ColorSpace", array);

        HPDF_Array_AddName (array, "Indexed");
        HPDF_Array_AddName (array, "DeviceRGB");
        HPDF_Array_AddNumber (array, num_pl - 1);

        b = HPDF_Binary_New (image->mmgr, ppallet, num_pl * 3);
        if (b)
            HPDF_Array_Add (array, b);
    }

    HPDF_FreeMem (image->mmgr, ppallet);

    return image->error->error_no;
}